

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O0

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  int iVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uStack_78;
  int c_1;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint32_t tmp;
  uint32_t crc3;
  uint32_t crc2;
  uint32_t crc1;
  uint32_t crc0;
  int c;
  uint8_t *x;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  size_t n_local;
  char *data_local;
  uint32_t crc_local;
  
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate),
     iVar1 != 0)) {
    Extend::accelerate = CanAccelerateCRC32C();
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if ((Extend::accelerate & 1U) == 0) {
    puVar3 = (uint8_t *)(data + n);
    x._4_4_ = crc ^ 0xffffffff;
    puVar4 = anon_unknown_1::RoundUp<4>((uint8_t *)data);
    e = (uint8_t *)data;
    if (puVar4 <= puVar3) {
      for (; e != puVar4; e = e + 1) {
        x._4_4_ = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                           (long)(int)(x._4_4_ & 0xff ^ (uint)*e) * 4) ^ x._4_4_ >> 8;
      }
    }
    if (0xf < (long)puVar3 - (long)e) {
      uVar2 = anon_unknown_1::ReadUint32LE(e);
      crc2 = uVar2 ^ x._4_4_;
      crc3 = anon_unknown_1::ReadUint32LE(e + 4);
      tmp = anon_unknown_1::ReadUint32LE(e + 8);
      i._4_4_ = anon_unknown_1::ReadUint32LE(e + 0xc);
      puVar4 = e;
      while (e = puVar4 + 0x10, 0xf < (long)puVar3 - (long)e) {
        uVar2 = anon_unknown_1::ReadUint32LE(e);
        crc2 = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                (ulong)(crc2 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(crc2 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                        (ulong)(crc2 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(crc2 >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE(puVar4 + 0x14);
        crc3 = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                (ulong)(crc3 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(crc3 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                        (ulong)(crc3 >> 0x10 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(crc3 >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE(puVar4 + 0x18);
        tmp = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(tmp & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 + (ulong)(tmp >> 8 & 0xff) * 4
                       ) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(tmp >> 0x10 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(tmp >> 0x18) * 4);
        uVar2 = anon_unknown_1::ReadUint32LE(puVar4 + 0x1c);
        i._4_4_ = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                                   (ulong)(i._4_4_ & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                           (ulong)(i._4_4_ >> 8 & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                           (ulong)(i._4_4_ >> 0x10 & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                           (ulong)(i._4_4_ >> 0x18) * 4);
        puVar4 = e;
      }
      for (; 3 < (long)puVar3 - (long)e; e = e + 4) {
        uVar2 = anon_unknown_1::ReadUint32LE(e);
        uVar5 = crc2 & 0xff;
        uVar6 = crc2 >> 8;
        uVar7 = crc2 >> 0x10;
        uVar8 = crc2 >> 0x18;
        crc2 = crc3;
        crc3 = tmp;
        tmp = i._4_4_;
        i._4_4_ = uVar2 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar5 * 4
                                   ) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                           (ulong)(uVar6 & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable1 +
                           (ulong)(uVar7 & 0xff) * 4) ^
                  *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar8 * 4);
      }
      for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
        crc2 = crc2 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(crc2 & 0xff) * 4);
      }
      crc3 = crc2 ^ crc3;
      for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
        crc3 = crc3 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(crc3 & 0xff) * 4);
      }
      tmp = crc3 ^ tmp;
      for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
        tmp = tmp >> 8 ^
              *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(tmp & 0xff) * 4);
      }
      i._4_4_ = tmp ^ i._4_4_;
      for (uStack_78 = 0; uStack_78 < 4; uStack_78 = uStack_78 + 1) {
        i._4_4_ = i._4_4_ >> 8 ^
                  *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(i._4_4_ & 0xff) * 4
                           );
      }
      x._4_4_ = i._4_4_;
    }
    for (; e != puVar3; e = e + 1) {
      x._4_4_ = *(uint *)((anonymous_namespace)::kByteExtensionTable +
                         (long)(int)(x._4_4_ & 0xff ^ (uint)*e) * 4) ^ x._4_4_ >> 8;
    }
    data_local._4_4_ = x._4_4_ ^ 0xffffffff;
  }
  else {
    data_local._4_4_ = port::AcceleratedCRC32C(crc,data,n);
  }
  return data_local._4_4_;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}